

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresultstore.cpp
# Opt level: O2

int __thiscall
QtPrivate::ResultStoreBase::insertResultItem(ResultStoreBase *this,int index,ResultItem *resultItem)

{
  int iVar1;
  void *pvVar2;
  undefined4 uVar3;
  ResultItem *pRVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->insertIndex;
  local_2c = index;
  if ((iVar1 < index & index != -1 & this->m_filterMode) == 1) {
    pRVar4 = QMap<int,_QtPrivate::ResultItem>::operator[](&this->pendingResults,&local_2c);
    uVar3 = *(undefined4 *)&resultItem->field_0x4;
    pvVar2 = resultItem->result;
    pRVar4->m_count = resultItem->m_count;
    *(undefined4 *)&pRVar4->field_0x4 = uVar3;
    pRVar4->result = pvVar2;
    iVar6 = local_2c;
  }
  else {
    iVar5 = resultItem->m_count + (uint)(resultItem->m_count == 0);
    if (index == -1) {
      iVar6 = iVar1;
      iVar5 = iVar5 + iVar1;
    }
    else {
      iVar5 = iVar5 + index;
      iVar6 = index;
      if (iVar5 <= iVar1) {
        iVar5 = iVar1;
      }
    }
    this->insertIndex = iVar5;
    insertResultItemIfValid(this,iVar6 - this->filteredResults,resultItem);
  }
  syncPendingResults(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int ResultStoreBase::insertResultItem(int index, ResultItem &resultItem)
{
    int storeIndex;
    if (m_filterMode && index != -1 && index > insertIndex) {
        pendingResults[index] = resultItem;
        storeIndex = index;
    } else {
        storeIndex = updateInsertIndex(index, resultItem.count());
        insertResultItemIfValid(storeIndex - filteredResults, resultItem);
    }
    syncPendingResults();
    return storeIndex;
}